

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void nni_http_get_body(nng_http *conn,void **datap,size_t *sizep)

{
  nng_http_res *pnVar1;
  nng_http_res *pnVar2;
  
  pnVar1 = &conn->res;
  pnVar2 = &conn->res;
  if (conn->client == false) {
    pnVar1 = (nng_http_res *)&conn->req;
    pnVar2 = (nng_http_res *)&conn->req;
  }
  *datap = (((nng_http_req *)pnVar1)->data).data;
  *sizep = (((nng_http_req *)pnVar2)->data).size;
  return;
}

Assistant:

void
nni_http_get_body(nng_http *conn, void **datap, size_t *sizep)
{
	if (conn->client) {
		*datap = conn->res.data.data;
		*sizep = conn->res.data.size;
	} else {
		*datap = conn->req.data.data;
		*sizep = conn->req.data.size;
	}
}